

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O1

parser_error parse_entry_priority(parser *p)

{
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  long *plVar4;
  char *__s1;
  long lVar5;
  parser_error pVar6;
  int iVar7;
  long lVar8;
  char *end;
  char *local_30;
  
  plVar4 = (long *)parser_priv(p);
  if (plVar4 == (long *)0x0) {
    pVar6 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    __s1 = parser_getstr(p,"priority");
    iVar7 = 1;
    lVar8 = 0;
    do {
      iVar2 = strcmp(__s1,*(char **)((long)&priority_schemes[1].name + lVar8));
      if (iVar2 == 0) {
        uVar3 = 0;
        if (*(char *)((long)plVar4 + 0x1c) == '\x01') {
          uVar3 = (**(code **)((long)&priority_schemes[1].priority + lVar8))
                            (*(undefined4 *)(*plVar4 + 0x1b4));
          iVar7 = 0;
        }
        goto LAB_001e43bc;
      }
      iVar7 = iVar7 + 1;
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x20);
    lVar8 = strtol(__s1,&local_30,10);
    iVar7 = 0;
    if (*__s1 == '\0') {
      uVar3 = 0;
      bVar1 = false;
    }
    else {
      uVar3 = 0;
      bVar1 = false;
      if (*local_30 == '\0') {
        lVar5 = -0x80000000;
        if (-0x80000000 < lVar8) {
          lVar5 = lVar8;
        }
        if (0x7ffffffe < lVar5) {
          lVar5 = 0x7fffffff;
        }
        uVar3 = (undefined4)lVar5;
        bVar1 = true;
      }
    }
    pVar6 = PARSE_ERROR_NOT_NUMBER;
    if (bVar1) {
LAB_001e43bc:
      lVar8 = (long)(int)plVar4[3];
      if (lVar8 == -1) {
        *(int *)((long)plVar4 + 0x14) = iVar7;
        *(undefined4 *)(*plVar4 + 0x1b0) = uVar3;
      }
      else if (*(char *)((long)plVar4 + 0x1c) == '\x01') {
        lVar5 = *(long *)(*plVar4 + 8);
        *(undefined4 *)(lVar5 + 8 + lVar8 * 0x10) = uVar3;
        *(undefined1 *)(lVar5 + 0xc + lVar8 * 0x10) = 1;
      }
      else {
        lVar5 = plVar4[1];
        *(int *)(lVar5 + 8 + lVar8 * 0x18) = iVar7;
        *(undefined4 *)(lVar5 + 0xc + lVar8 * 0x18) = uVar3;
        *(undefined1 *)(lVar5 + 0x10 + lVar8 * 0x18) = 1;
      }
      pVar6 = PARSE_ERROR_NONE;
    }
  }
  return pVar6;
}

Assistant:

static enum parser_error parse_entry_priority(struct parser *p)
{
	struct embryonic_ui_entry *embryo = parser_priv(p);
	const char *name;
	int psource_index = 0;
	int priority = 0;
	int n = N_ELEMENTS(priority_schemes);
	int i;

	if (!embryo) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	name = parser_getstr(p, "priority");
	i = 1;
	while (1) {
		if (i >= n) {
			char *end;
			long v;

			v = strtol(name, &end, 10);
			if (! *name || *end) {
				return PARSE_ERROR_NOT_NUMBER;
			}
			priority = (v <= INT_MAX) ?
				((v >= INT_MIN) ? v : INT_MIN) : INT_MAX;
			break;
		}
		if (streq(name, priority_schemes[i].name)) {
			if (embryo->exists) {
				priority = (*priority_schemes[i].priority)(
					embryo->entry->param_index);
			} else {
				psource_index = i;
			}
			break;
		}
		++i;
	}
	if (embryo->last_category_index == -1) {
		embryo->psource_index = psource_index;
		embryo->entry->default_priority = priority;
	} else {
		if (embryo->exists) {
			embryo->entry->categories[embryo->last_category_index].priority = priority;
			embryo->entry->categories[embryo->last_category_index].priority_set = true;
		} else {
			embryo->categories[embryo->last_category_index].psource_index = psource_index;
			embryo->categories[embryo->last_category_index].priority = priority;
			embryo->categories[embryo->last_category_index].priority_set = true;
		}
	}
	return PARSE_ERROR_NONE;
}